

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O3

void __thiscall
vkt::
InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>::Args,_vkt::FunctionPrograms1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>_>
::initPrograms(InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>::Args,_vkt::FunctionPrograms1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>_>
               *this,SourceCollections *dst)

{
  Function p_Var1;
  pointer pcVar2;
  Parameters PVar3;
  undefined8 in_stack_ffffffffffffffb8;
  VkShaderStageFlagBits VVar4;
  undefined4 in_stack_ffffffffffffffc4;
  undefined1 *puVar5;
  undefined8 in_stack_ffffffffffffffd0;
  long in_stack_ffffffffffffffd8;
  
  p_Var1 = (this->m_progs).m_func;
  VVar4 = (this->m_arg0).arg0.shaderStage;
  pcVar2 = (this->m_arg0).arg0.binaryName._M_dataplus._M_p;
  puVar5 = &stack0xffffffffffffffd8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffffc8,pcVar2,
             pcVar2 + (this->m_arg0).arg0.binaryName._M_string_length);
  PVar3.binaryName._M_dataplus._M_p._0_4_ = VVar4;
  PVar3._0_8_ = in_stack_ffffffffffffffb8;
  PVar3.binaryName._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffffc4;
  PVar3.binaryName._M_string_length = (size_type)puVar5;
  PVar3.binaryName.field_2._M_allocated_capacity = in_stack_ffffffffffffffd0;
  PVar3.binaryName.field_2._8_8_ = in_stack_ffffffffffffffd8;
  (*p_Var1)(dst,PVar3);
  if (puVar5 != &stack0xffffffffffffffd8) {
    operator_delete(puVar5,in_stack_ffffffffffffffd8 + 1);
  }
  return;
}

Assistant:

void			initPrograms		(vk::SourceCollections& dst) const { m_progs.init(dst, m_arg0); }